

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O0

void protect_rehash(refs_table_t *tbl,uint64_t v)

{
  uint64_t *puVar1;
  size_t sVar2;
  uint64_t uVar3;
  int iVar4;
  uint64_t d;
  int i;
  uint64_t *end;
  uint64_t *bucket;
  uint64_t v_local;
  refs_table_t *tbl_local;
  
  if ((v == 0) || (v == 0x7fffffffffffffff)) {
    return;
  }
  puVar1 = tbl->refs_table;
  uVar3 = sylvan_fnvhash8(v,0xcbf29ce484222325);
  end = puVar1 + uVar3 % tbl->refs_size;
  puVar1 = tbl->refs_table;
  sVar2 = tbl->refs_size;
  d._4_4_ = 0x80;
  do {
    iVar4 = d._4_4_ + -1;
    if (d._4_4_ == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_refs.c"
                    ,0x168,"void protect_rehash(refs_table_t *, uint64_t)");
    }
    if (*end == 0) {
      LOCK();
      uVar3 = *end;
      if (uVar3 == 0) {
        *end = v;
      }
      UNLOCK();
      if (uVar3 == 0) {
        return;
      }
    }
    end = end + 1;
    d._4_4_ = iVar4;
    if (end == puVar1 + sVar2) {
      end = tbl->refs_table;
    }
  } while( true );
}

Assistant:

static inline void
protect_rehash(refs_table_t *tbl, uint64_t v)
{
    if (v == 0) return; // do not rehash empty value
    if (v == refs_ts) return; // do not rehash tombstone

    _Atomic(uint64_t)* bucket = tbl->refs_table + (fnvhash8(v) % tbl->refs_size);
    _Atomic(uint64_t)* const end = tbl->refs_table + tbl->refs_size;

    int i = 128; // try 128 times linear probing
    while (i--) {
        uint64_t d = atomic_load(bucket);
        if (d == 0 && atomic_compare_exchange_strong(bucket, &d, v)) return;
        if (++bucket == end) bucket = tbl->refs_table;
    }

    assert(0); // whoops!
}